

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-2.c
# Opt level: O2

int feederBig2(void)

{
  FILE *__stream;
  size_t sVar1;
  int iVar2;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    fprintf(__stream,"%d\n",2000);
    fwrite("1346269\n",8,1,__stream);
    genTree((FILE *)__stream,0x1e,0,4000000);
    fputc(10,__stream);
    fclose(__stream);
    sVar1 = GetLabPointerSize();
    LabMemoryLimit = sVar1 * 0x2915ba + 0xe456e8;
  }
  return iVar2;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int T = 2000;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", T);
    fprintf(in, "1346269\n");
    genTree(in, 30, 0, 4000000);
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 1346269*(sizeof(int)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}